

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

ALLEGRO_FILE * al_create_file_handle(ALLEGRO_FILE_INTERFACE *drv,void *userdata)

{
  ALLEGRO_FILE *pAVar1;
  void *in_RSI;
  ALLEGRO_FILE_INTERFACE *in_RDI;
  ALLEGRO_FILE *f;
  char *in_stack_ffffffffffffffe8;
  
  pAVar1 = (ALLEGRO_FILE *)
           al_malloc_with_context
                     ((size_t)in_RDI,(int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8,
                      (char *)0x17543b);
  if (pAVar1 == (ALLEGRO_FILE *)0x0) {
    al_set_errno((int)((ulong)in_RSI >> 0x20));
  }
  else {
    pAVar1->vtable = in_RDI;
    pAVar1->userdata = in_RSI;
    pAVar1->ungetc_len = 0;
  }
  return pAVar1;
}

Assistant:

ALLEGRO_FILE *al_create_file_handle(const ALLEGRO_FILE_INTERFACE *drv,
   void *userdata)
{
   ALLEGRO_FILE *f;

   ASSERT(drv);

   f = al_malloc(sizeof(*f));
   if (!f) {
      al_set_errno(ENOMEM);
   }
   else {
      f->vtable = drv;
      f->userdata = userdata;
      f->ungetc_len = 0;
   }

   return f;
}